

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int add_hd_table_incremental
              (nghttp2_hd_context *context,nghttp2_hd_nv *nv,nghttp2_hd_map *map,uint32_t hash)

{
  uint32_t uVar1;
  nghttp2_mem *mem;
  int iVar2;
  nghttp2_hd_entry *pnVar3;
  ulong uVar4;
  nghttp2_hd_entry **ppnVar5;
  nghttp2_hd_entry *pnVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  
  mem = context->mem;
  uVar9 = nv->name->len + nv->value->len + 0x20;
  while ((context->hd_table_bufsize_max < context->hd_table_bufsize + uVar9 &&
         (sVar10 = (context->hd_table).len, sVar10 != 0))) {
    pnVar3 = hd_ringbuf_get(&context->hd_table,sVar10 - 1);
    context->hd_table_bufsize =
         (context->hd_table_bufsize - (((pnVar3->nv).name)->len + ((pnVar3->nv).value)->len)) - 0x20
    ;
    hd_ringbuf_pop_back(&context->hd_table);
    if (map != (nghttp2_hd_map *)0x0) {
      hd_map_remove(map,pnVar3);
    }
    nghttp2_hd_entry_free(pnVar3);
    nghttp2_mem_free(mem,pnVar3);
  }
  if (context->hd_table_bufsize_max < uVar9) {
    return 0;
  }
  pnVar3 = (nghttp2_hd_entry *)nghttp2_mem_malloc(mem,0x50);
  if (pnVar3 == (nghttp2_hd_entry *)0x0) {
LAB_00480df1:
    iVar2 = -0x385;
  }
  else {
    nghttp2_hd_entry_init(pnVar3,nv);
    sVar10 = (context->hd_table).mask;
    uVar4 = (context->hd_table).len + 1;
    if (sVar10 + 1 < uVar4) {
      uVar8 = 1;
      do {
        uVar7 = uVar8;
        uVar8 = uVar7 * 2;
      } while (uVar7 < uVar4);
      ppnVar5 = (nghttp2_hd_entry **)nghttp2_mem_malloc(mem,uVar7 * 8);
      if (ppnVar5 == (nghttp2_hd_entry **)0x0) {
        nghttp2_hd_entry_free(pnVar3);
        nghttp2_mem_free(mem,pnVar3);
        goto LAB_00480df1;
      }
      for (uVar4 = 0; uVar4 < (context->hd_table).len; uVar4 = uVar4 + 1) {
        pnVar6 = hd_ringbuf_get(&context->hd_table,uVar4);
        ppnVar5[uVar4] = pnVar6;
      }
      nghttp2_mem_free(mem,(context->hd_table).buffer);
      (context->hd_table).buffer = ppnVar5;
      sVar10 = uVar7 - 1;
      (context->hd_table).mask = sVar10;
      uVar4 = (context->hd_table).len + 1;
      uVar8 = 0xffffffffffffffff;
    }
    else {
      ppnVar5 = (context->hd_table).buffer;
      uVar8 = (context->hd_table).first - 1;
    }
    (context->hd_table).first = uVar8;
    ppnVar5[sVar10 & uVar8] = pnVar3;
    uVar1 = context->next_seq;
    (context->hd_table).len = uVar4;
    context->next_seq = uVar1 + 1;
    pnVar3->seq = uVar1;
    pnVar3->hash = hash;
    iVar2 = 0;
    if (map != (nghttp2_hd_map *)0x0) {
      if (map->table[hash & 0x7f] != (nghttp2_hd_entry *)0x0) {
        pnVar3->next = map->table[hash & 0x7f];
      }
      map->table[hash & 0x7f] = pnVar3;
    }
    context->hd_table_bufsize = context->hd_table_bufsize + uVar9;
  }
  return iVar2;
}

Assistant:

static int add_hd_table_incremental(nghttp2_hd_context *context,
                                    nghttp2_hd_nv *nv, nghttp2_hd_map *map,
                                    uint32_t hash) {
  int rv;
  nghttp2_hd_entry *new_ent;
  size_t room;
  nghttp2_mem *mem;

  mem = context->mem;
  room = entry_room(nv->name->len, nv->value->len);

  while (context->hd_table_bufsize + room > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {

    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);

    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);

    DEBUGF("hpack: remove item from header table: %s: %s\n",
           (char *)ent->nv.name->base, (char *)ent->nv.value->base);

    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }

  if (room > context->hd_table_bufsize_max) {
    /* The entry taking more than NGHTTP2_HD_MAX_BUFFER_SIZE is
       immediately evicted.  So we don't allocate memory for it. */
    return 0;
  }

  new_ent = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_entry));
  if (new_ent == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_hd_entry_init(new_ent, nv);

  rv = hd_ringbuf_push_front(&context->hd_table, new_ent, mem);

  if (rv != 0) {
    nghttp2_hd_entry_free(new_ent);
    nghttp2_mem_free(mem, new_ent);

    return rv;
  }

  new_ent->seq = context->next_seq++;
  new_ent->hash = hash;

  if (map) {
    hd_map_insert(map, new_ent);
  }

  context->hd_table_bufsize += room;

  return 0;
}